

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall flatbuffers::ts::TsGenerator::generateStructs(TsGenerator *this)

{
  StructDef *struct_def;
  Parser *pPVar1;
  import_set bare_imports;
  import_set imports;
  string type_name;
  string declcode;
  allocator<char> local_322;
  allocator<char> local_321;
  pointer local_320;
  IdlNamer *local_318;
  import_set local_310;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
  local_2e0;
  undefined1 local_2b0 [32];
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  Definition *local_1f0;
  Definition *pDStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
  local_120;
  
  pPVar1 = (this->super_BaseGenerator).parser_;
  local_318 = &this->namer_;
  for (local_320 = (pPVar1->structs_).vec.
                   super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_320 !=
      (pPVar1->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; local_320 = local_320 + 1) {
    local_310._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_310._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_310._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_310._M_t._M_impl.super__Rb_tree_header._M_header;
    local_310._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2e0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2e0._M_t._M_impl.super__Rb_tree_header._M_header;
    local_2e0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_310._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_310._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2e0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"* as flatbuffers",&local_321);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"flatbuffers",&local_322);
    local_2b0._0_8_ = local_2b0 + 0x10;
    local_2b0._8_8_ = 0;
    local_2b0[0x10] = '\0';
    local_290._M_p = (pointer)&local_280;
    local_288 = 0;
    local_280._M_local_buf[0] = '\0';
    local_270._M_p = (pointer)&local_260;
    local_268 = 0;
    local_260._M_local_buf[0] = '\0';
    local_250._M_p = (pointer)&local_240;
    local_248 = 0;
    local_240._M_local_buf[0] = '\0';
    local_230._M_p = (pointer)&local_220;
    local_228 = 0;
    local_220._M_local_buf[0] = '\0';
    local_210._M_p = (pointer)&local_200;
    local_208 = 0;
    local_200._M_local_buf[0] = '\0';
    local_1f0 = (Definition *)0x0;
    pDStack_1e8 = (Definition *)0x0;
    std::__cxx11::string::_M_assign((string *)local_2b0);
    std::operator+(&local_1c0,"import ",&local_160);
    std::operator+(&local_1a0,&local_1c0," from \'");
    std::operator+(&local_140,&local_1a0,&local_1e0);
    std::operator+(&local_120.first,&local_140,"\';");
    std::__cxx11::string::operator=((string *)&local_290,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string((string *)&local_120,(string *)&local_160);
    anon_unknown_10::ImportDefinition::ImportDefinition
              (&local_120.second,(ImportDefinition *)local_2b0);
    std::
    map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
    ::insert<std::pair<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition>>
              ((map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
                *)&local_310,&local_120);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
    ::~pair(&local_120);
    anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)local_2b0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_160);
    struct_def = *local_320;
    local_120.first._M_dataplus._M_p = (pointer)&local_120.first.field_2;
    local_120.first._M_string_length = 0;
    local_120.first.field_2._M_local_buf[0] = '\0';
    GenStruct(this,(this->super_BaseGenerator).parser_,struct_def,&local_120.first,&local_2e0);
    (*(local_318->super_Namer)._vptr_Namer[0xf])((ImportDefinition *)local_2b0,local_318,struct_def)
    ;
    std::__cxx11::string::string((string *)&local_180,(string *)local_2b0);
    TrackNsDef(this,&struct_def->super_Definition,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    SaveType(this,&struct_def->super_Definition,&local_120.first,&local_2e0,&local_310);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::~string((string *)&local_120);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
    ::~map(&local_2e0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
    ::~map(&local_310);
    pPVar1 = (this->super_BaseGenerator).parser_;
  }
  return;
}

Assistant:

void generateStructs() {
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      import_set bare_imports;
      import_set imports;
      AddImport(bare_imports, "* as flatbuffers", "flatbuffers");
      auto &struct_def = **it;
      std::string declcode;
      GenStruct(parser_, struct_def, &declcode, imports);
      std::string type_name = GetTypeName(struct_def);
      TrackNsDef(struct_def, type_name);
      SaveType(struct_def, declcode, imports, bare_imports);
    }
  }